

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O3

void __thiscall MessageCracker::~MessageCracker(MessageCracker *this)

{
  this[-1].super_MessageCracker.super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_0015d088;
  this[-1].super_MessageCracker.super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_0015d2d0;
  *(undefined ***)&this[-1].m_orderIDs._M_t._M_impl = &PTR__MessageCracker_0015d4c0;
  *(undefined ***)&this[-1].m_orderIDs._M_t._M_impl.super__Rb_tree_header._M_header =
       &PTR__MessageCracker_0015d7d0;
  this[-1].m_orderIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&PTR__MessageCracker_0015dc40;
  this[-1].m_orderIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)&PTR__MessageCracker_0015e240;
  this[-1].m_orderIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)&PTR__MessageCracker_0015e840;
  this[-1].m_orderIDs._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&PTR__MessageCracker_0015ef00;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_0015f5f0;
  std::
  _Rb_tree<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::_Identity<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::_Identity<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
               *)&(this->super_MessageCracker).super_MessageCracker);
  return;
}

Assistant:

void process( const FIX::Message& message, const FIX::SessionID& sessionID )
  {
    FIX::Message echo = message;
    FIX::PossResend possResend( false );
    message.getHeader().getFieldIfSet( possResend );

    FIX::ClOrdID clOrdID;
    message.getField( clOrdID );

    std::pair < FIX::ClOrdID, FIX::SessionID > pair =
      std::make_pair( clOrdID, sessionID );

    if ( possResend == true )
    {
      if ( m_orderIDs.find( pair ) != m_orderIDs.end() )
        return ;
    }
    m_orderIDs.insert( pair );
    FIX::Session::sendToTarget( echo, sessionID );
  }